

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::StringPtr> * kj::consumeWord(Maybe<kj::StringPtr> *__return_storage_ptr__,char **ptr)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = skipSpace(*ptr);
  lVar3 = 1;
  do {
    cVar1 = pcVar2[lVar3 + -1];
    if ((cVar1 == ' ') || (cVar1 == '\t')) {
      *ptr = pcVar2 + lVar3;
      pcVar2[lVar3 + -1] = '\0';
LAB_003076be:
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.content.ptr = pcVar2;
      *(long *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = lVar3;
      return __return_storage_ptr__;
    }
    if ((cVar1 == '\n') || (cVar1 == '\r')) {
      (__return_storage_ptr__->ptr).isSet = false;
      return __return_storage_ptr__;
    }
    if (cVar1 == '\0') {
      *ptr = pcVar2 + lVar3 + -1;
      goto LAB_003076be;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static kj::Maybe<kj::StringPtr> consumeWord(char*& ptr) {
  char* start = skipSpace(ptr);
  char* p = start;

  for (;;) {
    switch (*p) {
      case '\0':
        ptr = p;
        return kj::StringPtr(start, p);

      case '\t':
      case ' ': {
        char* end = p++;
        ptr = p;
        *end = '\0';
        return kj::StringPtr(start, end);
      }

      case '\n':
      case '\r':
        // Not expecting EOL!
        return kj::none;

      default:
        ++p;
        break;
    }
  }
}